

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O1

int ffgskyc(fitsfile *fptr,char *keyname,int firstchar,int maxchar,int maxcomchar,char *value,
           int *valuelen,char *comm,int *comlen,int *status)

{
  int iVar1;
  
  iVar1 = *status;
  if (iVar1 < 1) {
    ffglkut(fptr,keyname,firstchar,maxchar,maxcomchar,value,valuelen,comm,comlen,status);
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffgskyc( fitsfile *fptr,     /* I - FITS file pointer             */
           const char *keyname, /* I - name of keyword to read       */
           int firstchar,       /* I - first character of string to return */
           int maxchar,         /* I - maximum length of string to return */
	                        /*    (string will be null terminated)  */ 
           int maxcomchar,      /* I - maximum length of comment to return */     
           char *value,         /* O - pointer to keyword value      */
           int *valuelen,       /* O - total length of the keyword value string */
                                /*     The returned 'value' string may only */
				/*     contain a piece of the total string, depending */
				/*     on the value of firstchar and maxchar */
           char *comm,          /* O - keyword comment (may be NULL) */
           int *comlen,        /* O - total length of the comment string */
           int  *status)        /* IO - error status                 */
{
   if (*status > 0)
      return(*status);

   ffglkut(fptr,keyname,firstchar,maxchar,maxcomchar,value,valuelen,
             comm,comlen,status);      
      
   return(*status);
}